

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLContextState.cpp
# Opt level: O2

void __thiscall
Diligent::GLContextState::EnsureMemoryBarrier
          (GLContextState *this,MEMORY_BARRIER RequiredBarriers,AsyncWritableResource *pRes)

{
  MEMORY_BARRIER MVar1;
  MEMORY_BARRIER MVar2;
  MEMORY_BARRIER MVar3;
  GLenum err;
  string msg;
  uint local_54;
  string local_50;
  
  if (pRes == (AsyncWritableResource *)0x0) {
    MVar3 = MEMORY_BARRIER_NONE;
  }
  else {
    MVar3 = pRes->m_PendingMemoryBarriers;
    RequiredBarriers = RequiredBarriers & MVar3;
  }
  MVar2 = this->m_PendingMemoryBarriers;
  MVar1 = RequiredBarriers & MVar2;
  if (MVar1 != MEMORY_BARRIER_NONE) {
    (*__glewMemoryBarrier)(MVar1);
    local_54 = glGetError();
    if (local_54 != 0) {
      LogError<false,char[25],char[17],unsigned_int>
                (false,"EnsureMemoryBarrier",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0x1c2,(char (*) [25])"glMemoryBarrier() failed",(char (*) [17])"\nGL Error Code: "
                 ,&local_54);
      FormatString<char[6]>(&local_50,(char (*) [6])0x2b552e);
      DebugAssertionFailed
                (local_50._M_dataplus._M_p,"EnsureMemoryBarrier",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/GLContextState.cpp"
                 ,0x1c2);
      std::__cxx11::string::~string((string *)&local_50);
    }
    MVar2 = ~MVar1 & this->m_PendingMemoryBarriers;
    this->m_PendingMemoryBarriers = MVar2;
  }
  if (pRes != (AsyncWritableResource *)0x0) {
    pRes->m_PendingMemoryBarriers = MVar2 & MVar3;
  }
  return;
}

Assistant:

void GLContextState::EnsureMemoryBarrier(MEMORY_BARRIER RequiredBarriers, AsyncWritableResource* pRes /* = nullptr */)
{
#if GL_ARB_shader_image_load_store
    // Every resource tracks its own pending memory barriers.
    // Device context also tracks which barriers have not been executed
    // When a resource with pending memory barrier flag is bound to the context,
    // the context checks if the same flag is set in its own pending barriers.
    // Thus a memory barrier is only executed if some resource required that barrier
    // and it has not been executed yet. This is almost optimal strategy, but slightly
    // imperfect as the following scenario shows:

    // Draw 1: Barriers_A |= BARRIER_FLAG, Barrier_Ctx |= BARRIER_FLAG
    // Draw 2: Barriers_B |= BARRIER_FLAG, Barrier_Ctx |= BARRIER_FLAG
    // Draw 3: Bind B, execute BARRIER: Barriers_B = 0, Barrier_Ctx = 0 (Barriers_A == BARRIER_FLAG)
    // Draw 4: Barriers_B |= BARRIER_FLAG, Barrier_Ctx |= BARRIER_FLAG
    // Draw 5: Bind A, execute BARRIER, Barriers_A = 0, Barrier_Ctx = 0 (Barriers_B == BARRIER_FLAG)

    // In the last draw call, barrier for resource A has already been executed when resource B was
    // bound to the pipeline. Since Resource A has not been bound since then, its flag has not been
    // cleared.
    // This situation does not seem to be a problem though since a barrier cannot be executed
    // twice in any situation

    MEMORY_BARRIER ResourcePendingBarriers = MEMORY_BARRIER_NONE;
    if (pRes)
    {
        // If resource is specified, only set up memory barriers
        // that are required by the resource
        ResourcePendingBarriers = pRes->GetPendingMemoryBarriers();
        RequiredBarriers &= ResourcePendingBarriers;
    }

    // Leave only pending barriers
    RequiredBarriers &= m_PendingMemoryBarriers;
    if (RequiredBarriers)
    {
        glMemoryBarrier(RequiredBarriers);
        DEV_CHECK_GL_ERROR("glMemoryBarrier() failed");
        m_PendingMemoryBarriers &= ~RequiredBarriers;
    }

    // Leave only these barriers that are still pending
    if (pRes)
        pRes->ResetPendingMemoryBarriers(m_PendingMemoryBarriers & ResourcePendingBarriers);
#else
    UNSUPPORTED("GL_ARB_shader_image_load_store is not supported");
#endif
}